

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  CURLcode result;
  Curl_easy *data;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  conn_local._4_4_ = pop3_init(conn);
  if (conn_local._4_4_ == CURLE_OK) {
    conn->tls_upgraded = false;
    (pCVar1->state).path = (pCVar1->state).path + 1;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;

  /* Initialise the POP3 layer */
  CURLcode result = pop3_init(conn);
  if(result)
    return result;

  /* Clear the TLS upgraded flag */
  conn->tls_upgraded = FALSE;
  data->state.path++;   /* don't include the initial slash */

  return CURLE_OK;
}